

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O1

IVec2 __thiscall eglu::NativeWindow::getSurfaceSize(NativeWindow *this)

{
  byte bVar1;
  NotSupportedError *this_00;
  long in_RSI;
  pointer_____offset_0x10___ *ppuVar2;
  
  bVar1 = *(byte *)(in_RSI + 8);
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((bVar1 & 4) == 0) {
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeWindow doesn\'t support querying the surface size",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x35);
    ppuVar2 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::InternalError::InternalError
              ((InternalError *)this_00,(char *)0x0,
               "(m_capabilities & CAPABILITY_GET_SURFACE_SIZE) == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
               ,0x34);
    ppuVar2 = &tcu::InternalError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar2,tcu::Exception::~Exception);
}

Assistant:

tcu::IVec2 NativeWindow::getSurfaceSize (void) const
{
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_GET_SURFACE_SIZE) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support querying the surface size", DE_NULL, __FILE__, __LINE__);
}